

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O0

float vkt::pipeline::anon_unknown_0::BlendTestInstance::getNormChannelThreshold
                (TextureFormat *format,int numBits)

{
  TextureChannelClass TVar1;
  int numBits_local;
  TextureFormat *format_local;
  
  TVar1 = tcu::getTextureChannelClass(format->type);
  if (TVar1 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    format_local._4_4_ = 4.0 / (float)((1 << ((byte)numBits - 1 & 0x1f)) + -1);
  }
  else if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    format_local._4_4_ = 4.0 / (float)((1 << ((byte)numBits & 0x1f)) + -1);
  }
  else {
    format_local._4_4_ = 0.0;
  }
  return format_local._4_4_;
}

Assistant:

float BlendTestInstance::getNormChannelThreshold (const tcu::TextureFormat& format, int numBits)
{
	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:	return BlendTest::QUAD_COUNT / static_cast<float>((1 << numBits) - 1);
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:	return BlendTest::QUAD_COUNT / static_cast<float>((1 << (numBits - 1)) - 1);
		default:
			break;
	}

	DE_ASSERT(false);
	return 0.0f;
}